

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::AnsiUdpPortListSyntax::setChild
          (AnsiUdpPortListSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00b552ac + *(int *)(&DAT_00b552ac + in_RSI * 4)))();
  return;
}

Assistant:

void AnsiUdpPortListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: ports = child.node()->as<SeparatedSyntaxList<UdpPortDeclSyntax>>(); return;
        case 2: closeParen = child.token(); return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}